

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O0

void __thiscall Clasp::SequentialSolve::doStart(SequentialSolve *this,SharedContext *ctx,LitVec *gp)

{
  bool bVar1;
  int iVar2;
  BasicSolve *pBVar3;
  Solver *s;
  Enumerator *this_00;
  undefined4 extraout_var;
  SequentialSolve *this_01;
  Enumerator *pEVar4;
  SolveAlgorithm *in_RDI;
  undefined1 disjointPath;
  Solver *s_00;
  
  pBVar3 = (BasicSolve *)operator_new(0x28);
  s = SharedContext::master((SharedContext *)0x1e381f);
  this_00 = (Enumerator *)SharedContext::configuration((SharedContext *)0x1e3830);
  iVar2 = (*this_00->_vptr_Enumerator[7])(this_00,0);
  s_00 = (Solver *)CONCAT44(extraout_var,iVar2);
  this_01 = (SequentialSolve *)SolveAlgorithm::limits(in_RDI);
  BasicSolve::BasicSolve(pBVar3,s,(SolveParams *)s_00,(SolveLimits *)this_01);
  SingleOwnerPtr<Clasp::BasicSolve,_Clasp::DeleteObject>::reset
            ((SingleOwnerPtr<Clasp::BasicSolve,_Clasp::DeleteObject> *)this_00,(BasicSolve *)s_00);
  pEVar4 = SolveAlgorithm::enumerator((SolveAlgorithm *)0x1e3893);
  disjointPath = (undefined1)((ulong)pEVar4 >> 0x38);
  pBVar3 = SingleOwnerPtr<Clasp::BasicSolve,_Clasp::DeleteObject>::operator->
                     ((SingleOwnerPtr<Clasp::BasicSolve,_Clasp::DeleteObject> *)0x1e38a5);
  BasicSolve::solver(pBVar3);
  bVar1 = Enumerator::start(this_00,s_00,(LitVec *)this_01,(bool)disjointPath);
  if (!bVar1) {
    doStop(this_01);
  }
  return;
}

Assistant:

void SequentialSolve::doStart(SharedContext& ctx, const LitVec& gp) {
	solve_.reset(new BasicSolve(*ctx.master(), ctx.configuration()->search(0), limits()));
	if (!enumerator().start(solve_->solver(), gp)) { SequentialSolve::doStop(); }
}